

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildWithDepsLogTestDepsIgnoredInDryRun::BuildWithDepsLogTestDepsIgnoredInDryRun
          (BuildWithDepsLogTestDepsIgnoredInDryRun *this)

{
  BuildWithDepsLogTestDepsIgnoredInDryRun *this_local;
  
  BuildWithDepsLogTest::BuildWithDepsLogTest(&this->super_BuildWithDepsLogTest);
  (this->super_BuildWithDepsLogTest).super_BuildTest.super_StateTestWithBuiltinRules.super_Test.
  _vptr_Test = (_func_int **)&PTR__BuildWithDepsLogTestDepsIgnoredInDryRun_0025a888;
  (this->super_BuildWithDepsLogTest).super_BuildTest.super_BuildLogUser._vptr_BuildLogUser =
       (_func_int **)&DAT_0025a8c8;
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, DepsIgnoredInDryRun) {
  const char* manifest =
      "build out: cat in1\n"
      "  deps = gcc\n"
      "  depfile = in1.d\n";

  fs_.Create("out", "");
  fs_.Tick();
  fs_.Create("in1", "");

  State state;
  ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

  // The deps log is NULL in dry runs.
  config_.dry_run = true;
  Builder builder(&state, config_, NULL, NULL, &fs_);
  builder.command_runner_.reset(&command_runner_);
  command_runner_.commands_ran_.clear();

  string err;
  EXPECT_TRUE(builder.AddTarget("out", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder.Build(&err));
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());

  builder.command_runner_.release();
}